

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

void __thiscall ContainerToReaderWrapper::deleteReader(ContainerToReaderWrapper *this,int readerID)

{
  iterator __position;
  _Base_ptr p_Var1;
  key_type_conflict1 local_1c;
  
  local_1c = readerID;
  __position = std::
               _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>,_std::_Select1st<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>_>
               ::find(&(this->m_readerInfo)._M_t,&local_1c);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<int,_std::pair<const_int,_DemuxerReadPolicy>,_std::_Select1st<std::pair<const_int,_DemuxerReadPolicy>_>,_std::less<int>,_std::allocator<std::pair<const_int,_DemuxerReadPolicy>_>_>
    ::erase((_Rb_tree<int,_std::pair<const_int,_DemuxerReadPolicy>,_std::_Select1st<std::pair<const_int,_DemuxerReadPolicy>_>,_std::less<int>,_std::allocator<std::pair<const_int,_DemuxerReadPolicy>_>_>
             *)__position._M_node[1]._M_parent,(key_type_conflict *)&__position._M_node[1]._M_left);
    p_Var1 = __position._M_node[1]._M_parent;
    if (p_Var1[1]._M_parent == (_Base_ptr)0x0) {
      if (*(long **)(p_Var1 + 3) != (long *)0x0) {
        (**(code **)(**(long **)(p_Var1 + 3) + 8))();
        p_Var1 = __position._M_node[1]._M_parent;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
      ::erase(&(this->m_demuxers)._M_t,(key_type *)&p_Var1[3]._M_parent);
    }
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>,std::_Select1st<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>,std::_Select1st<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>>
                        *)&this->m_readerInfo,__position);
  }
  return;
}

Assistant:

void ContainerToReaderWrapper::deleteReader(const int readerID)
{
    const auto itr = m_readerInfo.find(readerID);
    if (itr == m_readerInfo.end())
        return;
    const ReaderInfo& ri = itr->second;
    ri.m_demuxerData.m_pids.erase(ri.m_pid);
    if (ri.m_demuxerData.m_pids.empty())
    {
        delete ri.m_demuxerData.m_demuxer;
        m_demuxers.erase(ri.m_demuxerData.m_streamName);
    }
    m_readerInfo.erase(itr);
}